

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_read.cpp
# Opt level: O0

int find_str(char *a,char *b,int lena,int lenb)

{
  bool bVar1;
  int local_2c;
  int i;
  int lenb_local;
  int lena_local;
  char *b_local;
  char *a_local;
  
  local_2c = 0;
  while( true ) {
    if ((lena - lenb) + 1 <= local_2c) {
      return -1;
    }
    bVar1 = bincmp(a + local_2c,b,lenb);
    if (bVar1) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int find_str(char* a, const char* b,int lena,int lenb) {
	for (int i = 0; i < lena - lenb+1; i++)
	{
		if (bincmp(a + i, b, lenb))
			return i;
	}

	return -1;
}